

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SubVerify.cpp
# Opt level: O2

void SubVerifyBase<long,unsigned_char>(char *types)

{
  SafeInt<unsigned_char,_safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>_> rhs
  ;
  bool bVar1;
  pointer t;
  TestCase<long,_unsigned_char,_4> TVar2;
  allocator local_b1;
  char *local_b0;
  string msg;
  string local_88;
  TestVector<long,_unsigned_char,_4> tests;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_50;
  
  tests.test_cases = (TestCase<long,_unsigned_char,_4> *)0x0;
  tests.count = 0;
  tests.current = 0;
  local_b0 = types;
  TVar2 = TestVector<long,_unsigned_char,_4>::GetNext(&tests);
  while( true ) {
    t = (pointer)TVar2.x;
    if (tests.count <= tests.current) break;
    bVar1 = TVar2.fExpected;
    rhs.m_int = TVar2.y;
    if (bVar1 != (long)((long)t - (TVar2._8_8_ & 0xff)) <= (long)t) {
      std::__cxx11::string::string((string *)&local_88,"Error in case ",(allocator *)&local_50);
      std::operator+(&msg,&local_88,local_b0);
      std::__cxx11::string::~string((string *)&local_88);
      std::__cxx11::string::string((string *)&local_88,msg._M_dataplus._M_p,(allocator *)&local_50);
      err_msg<long,unsigned_char>(&local_88,(long)t,rhs.m_int,(bool)(bVar1 & 1));
      std::__cxx11::string::~string((string *)&local_88);
      std::__cxx11::string::~string((string *)&msg);
    }
    msg._M_dataplus._M_p = t;
    SafeInt<long,safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>>::operator-=
              ((SafeInt<long,safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>>
                *)&msg,rhs.m_int);
    if (bVar1 != true) {
      std::__cxx11::string::string((string *)&local_50,"Error in case ",&local_b1);
      std::operator+(&local_88,&local_50,local_b0);
      std::operator+(&msg,&local_88," throw (1): ");
      std::__cxx11::string::~string((string *)&local_88);
      std::__cxx11::string::~string((string *)&local_50);
      std::__cxx11::string::string((string *)&local_88,msg._M_dataplus._M_p,(allocator *)&local_50);
      err_msg<long,unsigned_char>(&local_88,(long)t,rhs.m_int,(bool)(bVar1 & 1));
      std::__cxx11::string::~string((string *)&local_88);
      std::__cxx11::string::~string((string *)&msg);
    }
    msg._M_dataplus._M_p = t;
    operator-=((long *)&msg,rhs);
    if (bVar1 != true) {
      std::__cxx11::string::string((string *)&local_50,"Error in case ",&local_b1);
      std::operator+(&local_88,&local_50,local_b0);
      std::operator+(&msg,&local_88," throw (2): ");
      std::__cxx11::string::~string((string *)&local_88);
      std::__cxx11::string::~string((string *)&local_50);
      std::__cxx11::string::string((string *)&local_88,msg._M_dataplus._M_p,(allocator *)&local_50);
      err_msg<long,unsigned_char>(&local_88,(long)t,rhs.m_int,(bool)(bVar1 & 1));
      std::__cxx11::string::~string((string *)&local_88);
      std::__cxx11::string::~string((string *)&msg);
    }
    TVar2 = TestVector<long,_unsigned_char,_4>::GetNext(&tests);
  }
  return;
}

Assistant:

void SubVerifyBase(const char* types)
{
    TestVector< T, U, OpType::Sub > tests;
    TestCase< T, U, OpType::Sub > test = tests.GetNext();

    while (!tests.Done())
    {
        T ret;
        if (SafeSubtract(test.x, test.y, ret) != test.fExpected)
        {
            std::string msg = std::string("Error in case ") + types;
            err_msg(msg.c_str(), test.x, test.y, test.fExpected);
        }

        // Now test throwing version
        bool fSuccess = true;
        try
        {
            SafeInt<T> si(test.x);
            si -= test.y;
        }
        catch (...)
        {
            fSuccess = false;
        }

        if (fSuccess != test.fExpected)
        {
            std::string msg = std::string("Error in case ") + types + " throw (1): ";
            err_msg(msg.c_str(), test.x, test.y, test.fExpected);
        }

        // Also need to test the version that assigns back out
        // to a plain int, as it has different logic
        fSuccess = true;
        try
        {
            T x(test.x);
            x -= SafeInt<U>(test.y);
        }
        catch (...)
        {
            fSuccess = false;
        }

        if (fSuccess != test.fExpected)
        {
            std::string msg = std::string("Error in case ") + types + " throw (2): ";
            err_msg(msg.c_str(), test.x, test.y, test.fExpected);
        }

        test = tests.GetNext();
    }
}